

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall TypeOpCall::getInputLocal(TypeOpCall *this,PcodeOp *op,int4 slot)

{
  bool bVar1;
  spacetype sVar2;
  int4 iVar3;
  int4 iVar4;
  uint uVar5;
  int iVar6;
  type_metatype tVar7;
  Varnode *pVVar8;
  AddrSpace *this_00;
  Datatype *pDVar9;
  Address *addr;
  FuncCallSpecs *this_01;
  ProtoParameter *pPVar10;
  undefined4 extraout_var;
  ProtoParameter *param;
  Datatype *ct;
  Varnode *vn;
  FuncCallSpecs *fc;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOpCall *this_local;
  
  pVVar8 = PcodeOp::getIn(op,0);
  if (slot != 0) {
    this_00 = Varnode::getSpace(pVVar8);
    sVar2 = AddrSpace::getType(this_00);
    if (sVar2 == IPTR_FSPEC) {
      addr = Varnode::getAddr(pVVar8);
      this_01 = FuncCallSpecs::getFspecFromConst(addr);
      iVar3 = FuncProto::numParams(&this_01->super_FuncProto);
      iVar4 = PcodeOp::numInput(op);
      if ((((iVar3 == iVar4 + -1) ||
           (bVar1 = FuncProto::isDotdotdot(&this_01->super_FuncProto), bVar1)) &&
          (pPVar10 = FuncProto::getParam(&this_01->super_FuncProto,slot + -1),
          pPVar10 != (ProtoParameter *)0x0)) &&
         (uVar5 = (*pPVar10->_vptr_ProtoParameter[6])(), (uVar5 & 1) != 0)) {
        iVar6 = (*pPVar10->_vptr_ProtoParameter[3])();
        pDVar9 = (Datatype *)CONCAT44(extraout_var,iVar6);
        tVar7 = Datatype::getMetatype(pDVar9);
        if (tVar7 != TYPE_VOID) {
          iVar3 = Datatype::getSize(pDVar9);
          pVVar8 = PcodeOp::getIn(op,slot);
          iVar4 = Varnode::getSize(pVVar8);
          if (iVar3 <= iVar4) {
            return pDVar9;
          }
        }
      }
      pDVar9 = TypeOp::getInputLocal(&this->super_TypeOp,op,slot);
      return pDVar9;
    }
  }
  pDVar9 = TypeOp::getInputLocal(&this->super_TypeOp,op,slot);
  return pDVar9;
}

Assistant:

Datatype *TypeOpCall::getInputLocal(const PcodeOp *op,int4 slot) const

{
  const FuncCallSpecs *fc;
  const Varnode *vn;
  Datatype *ct;

  vn = op->getIn(0);
  if ((slot==0)||(vn->getSpace()->getType()!=IPTR_FSPEC))// Do we have a prototype to look at
    return TypeOp::getInputLocal(op,slot);
    
  // Get types of call input parameters
  fc = FuncCallSpecs::getFspecFromConst(vn->getAddr());
  // Its false to assume that the parameter symbol corresponds
  // to the varnode in the same slot, but this is easiest until
  // we get giant sized parameters working properly
  if ((fc->numParams() == op->numInput()-1)||(fc->isDotdotdot())) {
    ProtoParameter *param = fc->getParam(slot-1);
    if ((param != (ProtoParameter *)0)&&(param->isTypeLocked())) {
      ct = param->getType();
      if ((ct->getMetatype() != TYPE_VOID)&&
	  (ct->getSize() <= op->getIn(slot)->getSize())) // parameter may not match varnode
	return ct;
    }
  }
  return TypeOp::getInputLocal(op,slot);
}